

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RX.cpp
# Opt level: O3

void __thiscall RX::RX(RX *this,RX *other)

{
  pointer pcVar1;
  
  this->_compiled = false;
  (this->_pattern)._M_dataplus._M_p = (pointer)&(this->_pattern).field_2;
  pcVar1 = (other->_pattern)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_pattern,pcVar1,pcVar1 + (other->_pattern)._M_string_length);
  this->_case_sensitive = other->_case_sensitive;
  return;
}

Assistant:

RX::RX (const RX& other)
: _compiled (false)
, _pattern (other._pattern)
, _case_sensitive (other._case_sensitive)
{
}